

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void basist::decoder_etc_block::get_block_colors5_g
               (int *pBlock_colors,color32 *base_color5,uint32_t inten_table)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  bVar1 = (base_color5->field_0).field_0.g;
  uVar2 = (uint)(bVar1 >> 2) | (uint)bVar1 * 8;
  uVar4 = (ulong)inten_table;
  uVar3 = (&g_etc1_inten_tables)[uVar4 * 4] + uVar2;
  if (0xff < uVar3) {
    if ((int)uVar3 < 0) {
      uVar3 = 0;
    }
    else if (0xfe < (int)uVar3) {
      uVar3 = 0xff;
    }
  }
  *pBlock_colors = uVar3;
  uVar3 = (&DAT_001ebb34)[uVar4 * 4] + uVar2;
  if (0xff < uVar3) {
    if ((int)uVar3 < 0) {
      uVar3 = 0;
    }
    else if (0xfe < (int)uVar3) {
      uVar3 = 0xff;
    }
  }
  pBlock_colors[1] = uVar3;
  uVar3 = (&DAT_001ebb38)[uVar4 * 4] + uVar2;
  if (0xff < uVar3) {
    if ((int)uVar3 < 0) {
      uVar3 = 0;
    }
    else if (0xfe < (int)uVar3) {
      uVar3 = 0xff;
    }
  }
  pBlock_colors[2] = uVar3;
  uVar2 = uVar2 + (&DAT_001ebb3c)[uVar4 * 4];
  uVar3 = uVar2;
  if (0xff < uVar2) {
    if ((int)uVar2 < 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0xff;
      if ((int)uVar2 < 0xff) {
        uVar3 = uVar2;
      }
    }
  }
  pBlock_colors[3] = uVar3;
  return;
}

Assistant:

static void get_block_colors5_g(int* pBlock_colors, const color32& base_color5, uint32_t inten_table)
		{
			const int g = (base_color5.g << 3) | (base_color5.g >> 2);

			const int* pInten_table = g_etc1_inten_tables[inten_table];

			pBlock_colors[0] = clamp255(g + pInten_table[0]);
			pBlock_colors[1] = clamp255(g + pInten_table[1]);
			pBlock_colors[2] = clamp255(g + pInten_table[2]);
			pBlock_colors[3] = clamp255(g + pInten_table[3]);
		}